

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O0

void __thiscall cdnsBlockParameterOld::cdnsBlockParameterOld(cdnsBlockParameterOld *this)

{
  cdnsBlockParameterOld *this_local;
  
  this->query_timeout = 0;
  this->skew_timeout = 0;
  this->snaplen = 0;
  this->promisc = 0;
  std::vector<cbor_text,_std::allocator<cbor_text>_>::vector(&this->interfaces);
  std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::vector(&this->server_addresses);
  cbor_text::cbor_text(&this->filter);
  this->query_options = 0;
  this->response_options = 0;
  std::vector<cbor_text,_std::allocator<cbor_text>_>::vector(&this->accept_rr_types);
  std::vector<cbor_text,_std::allocator<cbor_text>_>::vector(&this->ignore_rr_types);
  this->max_block_qr_items = 0;
  this->collect_malformed = 0;
  return;
}

Assistant:

cdnsBlockParameterOld::cdnsBlockParameterOld():
    query_timeout(0),
    skew_timeout(0),
    snaplen(0),
    promisc(0),
    query_options(0),
    response_options(0),
    max_block_qr_items(0),
    collect_malformed(0)
{
}